

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O3

float __thiscall indk::Neuron::Entry::getIn(Entry *this)

{
  ulong uVar1;
  float fVar2;
  
  uVar1 = this->tm - this->t;
  fVar2 = 0.0;
  if ((-1 < (long)uVar1) && ((long)uVar1 < this->SignalPointer)) {
    this->t = this->t + 1;
    fVar2 = this->Signal[this->SignalPointer + ~uVar1];
  }
  return fVar2;
}

Assistant:

float indk::Neuron::Entry::getIn() {
    auto d = tm - t + 1;
    if (d > 0 && SignalPointer-d >= 0) {
        t++;
        return Signal[SignalPointer-d];
    }
    return 0;
}